

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

string * __thiscall
wallet::COutput::ToString_abi_cxx11_(string *__return_storage_ptr__,COutput *this)

{
  long in_FS_OFFSET;
  _Alloc_hider in_stack_ffffffffffffffa8;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_38,(base_blob<256u> *)&this->outpoint);
  FormatMoney_abi_cxx11_((string *)&stack0xffffffffffffffa8,(this->txout).nValue);
  tinyformat::format<std::__cxx11::string,unsigned_int,int,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"COutput(%s, %d, %d) [%s]",(char *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->outpoint).n,(uint *)&this->depth,(int *)&stack0xffffffffffffffa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string COutput::ToString() const
{
    return strprintf("COutput(%s, %d, %d) [%s]", outpoint.hash.ToString(), outpoint.n, depth, FormatMoney(txout.nValue));
}